

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int lookup_certificate(ptls_lookup_certificate_t *_self,ptls_t *tls,uint16_t *sign_algorithm,
                      _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **signer,void **signer_data,
                      ptls_iovec_t **certs,size_t *num_certs,char *server_name,
                      uint16_t *signature_algorithms,size_t num_signature_algorithms)

{
  uint16_t uVar1;
  int iVar2;
  size_t len;
  ptls_iovec_t x;
  size_t server_name_len;
  size_t i;
  st_ptls_openssl_identity_t *identity;
  ptls_openssl_lookup_certificate_t *self;
  ptls_iovec_t **certs_local;
  void **signer_data_local;
  _func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t **signer_local;
  uint16_t *sign_algorithm_local;
  ptls_t *tls_local;
  ptls_lookup_certificate_t *_self_local;
  
  if (_self[2].cb ==
      (_func_int_st_ptls_lookup_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr__func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_ptr_size_t_ptr_char_ptr_uint16_t_ptr_size_t
       *)0x0) {
    _self_local._4_4_ = 0x28;
  }
  else {
    if (server_name != (char *)0x0) {
      len = strlen(server_name);
      for (server_name_len = 0;
          (_func_int_st_ptls_lookup_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr__func_int_void_ptr_ptls_buffer_t_ptr_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_ptr_size_t_ptr_char_ptr_uint16_t_ptr_size_t
           *)server_name_len != _self[2].cb; server_name_len = server_name_len + 1) {
        i = *(size_t *)(_self[1].cb + server_name_len * 8);
        x = ptls_iovec_init(server_name,len);
        iVar2 = ascii_streq_caseless(x,*(ptls_iovec_t *)i);
        if (iVar2 != 0) {
          uVar1 = select_compatible_signature_algorithm
                            ((EVP_PKEY *)((ptls_iovec_t *)(i + 0x10))->base,signature_algorithms,
                             num_signature_algorithms);
          *sign_algorithm = uVar1;
          if (uVar1 != 0xffff) goto LAB_00105064;
        }
      }
    }
    i = *(size_t *)_self[1].cb;
    uVar1 = select_compatible_signature_algorithm
                      (*(EVP_PKEY **)(i + 0x10),signature_algorithms,num_signature_algorithms);
    *sign_algorithm = uVar1;
    if (uVar1 == 0xffff) {
      _self_local._4_4_ = 0x28;
    }
    else {
LAB_00105064:
      *signer = rsapss_sign;
      *signer_data = *(void **)(i + 0x10);
      *certs = (ptls_iovec_t *)(i + 0x20);
      *num_certs = *(size_t *)(i + 0x18);
      _self_local._4_4_ = 0;
    }
  }
  return _self_local._4_4_;
}

Assistant:

static int lookup_certificate(ptls_lookup_certificate_t *_self, ptls_t *tls, uint16_t *sign_algorithm,
                              int (**signer)(void *sign_ctx, ptls_buffer_t *outbuf, ptls_iovec_t input), void **signer_data,
                              ptls_iovec_t **certs, size_t *num_certs, const char *server_name,
                              const uint16_t *signature_algorithms, size_t num_signature_algorithms)
{
    ptls_openssl_lookup_certificate_t *self = (ptls_openssl_lookup_certificate_t *)_self;
    struct st_ptls_openssl_identity_t *identity;

    if (self->count == 0)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    if (server_name != NULL) {
        size_t i, server_name_len = strlen(server_name);
        for (i = 0; i != self->count; ++i) {
            identity = self->identities[i];
            if (ascii_streq_caseless(ptls_iovec_init(server_name, server_name_len), identity->name) &&
                (*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms,
                                                                         num_signature_algorithms)) != UINT16_MAX)
                goto Found;
        }
    }
    /* not found, use the first one, if the signing algorithm matches */
    identity = self->identities[0];
    if ((*sign_algorithm = select_compatible_signature_algorithm(identity->key, signature_algorithms, num_signature_algorithms)) ==
        UINT16_MAX)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    /* setup the rest */
    *signer = rsapss_sign;
    *signer_data = identity->key;
    *certs = identity->certs;
    *num_certs = identity->num_certs;

    return 0;
}